

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

int enet_protocol_dispatch_incoming_commands(ENetHost *host,ENetEvent *event)

{
  ENetList *position;
  ENetPeerState EVar1;
  ENetListIterator position_00;
  ENetPeer *peer;
  ENetPacket *pEVar2;
  
  position = &host->dispatchQueue;
  do {
    while( true ) {
      position_00 = (position->sentinel).next;
      if (position_00 == &position->sentinel) {
        return 0;
      }
      peer = (ENetPeer *)enet_list_remove(position_00);
      peer->needsDispatch = 0;
      EVar1 = peer->state;
      if (EVar1 != ENET_PEER_STATE_CONNECTED) break;
      if ((peer->dispatchedCommands).sentinel.next != &(peer->dispatchedCommands).sentinel) {
        pEVar2 = enet_peer_receive(peer,&event->channelID);
        event->packet = pEVar2;
        if (pEVar2 != (ENetPacket *)0x0) {
          event->type = ENET_EVENT_TYPE_RECEIVE;
          event->peer = peer;
          if ((peer->dispatchedCommands).sentinel.next != &(peer->dispatchedCommands).sentinel) {
            peer->needsDispatch = 1;
            enet_list_insert(&position->sentinel,peer);
          }
          return 1;
        }
      }
    }
    if (EVar1 - ENET_PEER_STATE_CONNECTION_PENDING < 2) {
      enet_peer_on_connect(peer);
      peer->state = ENET_PEER_STATE_CONNECTED;
      event->type = ENET_EVENT_TYPE_CONNECT;
      event->peer = peer;
      event->data = peer->eventData;
      return 1;
    }
  } while (EVar1 != ENET_PEER_STATE_ZOMBIE);
  host->recalculateBandwidthLimits = 1;
  event->type = ENET_EVENT_TYPE_DISCONNECT;
  event->peer = peer;
  event->data = peer->eventData;
  enet_peer_reset(peer);
  return 1;
}

Assistant:

static int
enet_protocol_dispatch_incoming_commands (ENetHost * host, ENetEvent * event)
{
    while (! enet_list_empty (& host -> dispatchQueue))
    {
       ENetPeer * peer = (ENetPeer *) enet_list_remove (enet_list_begin (& host -> dispatchQueue));

       peer -> needsDispatch = 0;

       switch (peer -> state)
       {
       case ENET_PEER_STATE_CONNECTION_PENDING:
       case ENET_PEER_STATE_CONNECTION_SUCCEEDED:
           enet_protocol_change_state (host, peer, ENET_PEER_STATE_CONNECTED);

           event -> type = ENET_EVENT_TYPE_CONNECT;
           event -> peer = peer;
           event -> data = peer -> eventData;

           return 1;
           
       case ENET_PEER_STATE_ZOMBIE:
           host -> recalculateBandwidthLimits = 1;

           event -> type = ENET_EVENT_TYPE_DISCONNECT;
           event -> peer = peer;
           event -> data = peer -> eventData;

           enet_peer_reset (peer);

           return 1;

       case ENET_PEER_STATE_CONNECTED:
           if (enet_list_empty (& peer -> dispatchedCommands))
             continue;

           event -> packet = enet_peer_receive (peer, & event -> channelID);
           if (event -> packet == NULL)
             continue;
             
           event -> type = ENET_EVENT_TYPE_RECEIVE;
           event -> peer = peer;

           if (! enet_list_empty (& peer -> dispatchedCommands))
           {
              peer -> needsDispatch = 1;
         
              enet_list_insert (enet_list_end (& host -> dispatchQueue), & peer -> dispatchList);
           }

           return 1;

       default:
           break;
       }
    }

    return 0;
}